

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::ForkBranch<kj::Rc<kj::Refcounted>,_true>::get
          (ForkBranch<kj::Rc<kj::Refcounted>,_true> *this,ExceptionOrValue *output)

{
  ExceptionOrValue *this_00;
  ExceptionOr<kj::Rc<kj::Refcounted>_> *pEVar1;
  Rc<kj::Refcounted> local_40;
  Rc<kj::Refcounted> *local_30;
  Rc<kj::Refcounted> *value;
  Rc<kj::Refcounted> *_value846;
  ExceptionOr<kj::Rc<kj::Refcounted>_> *hubResult;
  ExceptionOrValue *output_local;
  ForkBranch<kj::Rc<kj::Refcounted>,_true> *this_local;
  
  hubResult = (ExceptionOr<kj::Rc<kj::Refcounted>_> *)output;
  output_local = (ExceptionOrValue *)this;
  this_00 = ForkBranchBase::getHubResultRef(&this->super_ForkBranchBase);
  _value846 = (Rc<kj::Refcounted> *)ExceptionOrValue::as<kj::Rc<kj::Refcounted>>(this_00);
  value = readMaybe<kj::Rc<kj::Refcounted>>
                    (&((ExceptionOr<kj::Rc<kj::Refcounted>_> *)_value846)->value);
  if (value == (Rc<kj::Refcounted> *)0x0) {
    pEVar1 = ExceptionOrValue::as<kj::Rc<kj::Refcounted>>(&hubResult->super_ExceptionOrValue);
    Maybe<kj::Rc<kj::Refcounted>_>::operator=(&pEVar1->value);
  }
  else {
    local_30 = value;
    copyOrAddRef<kj::Refcounted>(&local_40);
    pEVar1 = ExceptionOrValue::as<kj::Rc<kj::Refcounted>>(&hubResult->super_ExceptionOrValue);
    Maybe<kj::Rc<kj::Refcounted>_>::operator=(&pEVar1->value,&local_40);
    Rc<kj::Refcounted>::~Rc(&local_40);
  }
  Maybe<kj::Exception>::operator=
            ((Maybe<kj::Exception> *)hubResult,(Maybe<kj::Exception> *)_value846);
  ForkBranchBase::releaseHub(&this->super_ForkBranchBase,&hubResult->super_ExceptionOrValue);
  return;
}

Assistant:

void get(ExceptionOrValue& output) noexcept override {
    ExceptionOr<T>& hubResult = getHubResultRef().template as<T>();
    KJ_IF_SOME(value, hubResult.value) {
      output.as<T>().value = copyOrAddRef(value);
    } else {
      output.as<T>().value = kj::none;
    }